

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGeneratorRequest::MergePartialFromCodedStream
          (CodeGeneratorRequest *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  string *psVar5;
  char *pcVar6;
  Version *value;
  FileDescriptorProto *value_00;
  UnknownFieldSet *unknown_fields;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  CodeGeneratorRequest *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
LAB_003bfd4b:
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) goto LAB_003c0116;
    iVar2 = internal::WireFormatLite::GetTagFieldNumber(local_10);
    switch(iVar2) {
    case 1:
      if ((tag_00 & 0xff) == 10) {
        psVar5 = add_file_to_generate_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        iVar2 = file_to_generate_size(this);
        file_to_generate_abi_cxx11_(this,iVar2 + -1);
        pcVar6 = (char *)std::__cxx11::string::data();
        iVar2 = file_to_generate_size(this);
        file_to_generate_abi_cxx11_(this,iVar2 + -1);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,
                   "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        goto LAB_003bfd4b;
      }
      break;
    case 2:
      if ((tag_00 & 0xff) == 0x12) {
        psVar5 = mutable_parameter_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        parameter_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        parameter_abi_cxx11_(this);
        iVar2 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8StringNamedField
                  (pcVar6,iVar2,PARSE,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
        goto LAB_003bfd4b;
      }
      break;
    case 3:
      if ((tag_00 & 0xff) != 0x1a) break;
      value = mutable_compiler_version(this);
      bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::compiler::Version>
                        (input,value);
      goto joined_r0x003c010a;
    default:
      break;
    case 0xf:
      if ((tag_00 & 0xff) == 0x7a) {
        value_00 = add_proto_file(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::FileDescriptorProto>(input,value_00);
        goto joined_r0x003c010a;
      }
    }
LAB_003c0116:
    if ((tag_00 == 0) ||
       (WVar3 = internal::WireFormatLite::GetTagWireType(tag_00), WVar3 == WIRETYPE_END_GROUP)) {
      return true;
    }
    unknown_fields = mutable_unknown_fields(this);
    bVar1 = internal::WireFormat::SkipField(input,tag_00,unknown_fields);
joined_r0x003c010a:
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool CodeGeneratorRequest::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.compiler.CodeGeneratorRequest)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated string file_to_generate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_file_to_generate()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->file_to_generate(this->file_to_generate_size() - 1).data(),
            this->file_to_generate(this->file_to_generate_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string parameter = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_parameter()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->parameter().data(), this->parameter().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "google.protobuf.compiler.CodeGeneratorRequest.parameter");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_compiler_version()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_proto_file()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.compiler.CodeGeneratorRequest)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.compiler.CodeGeneratorRequest)
  return false;
#undef DO_
}